

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

char * d_dup_pathname_str(char *s)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  
  if (s == (char *)0x0) {
    pcVar4 = (char *)malloc(1);
    pcVar1 = pcVar4;
  }
  else if (*s == '\"') {
    lVar3 = 0;
    for (pcVar1 = s + 1; (*pcVar1 != '\0' && (*pcVar1 != '\"')); pcVar1 = pcVar1 + 1) {
      lVar3 = lVar3 + 0x100000000;
    }
    pcVar1 = (char *)malloc(lVar3 + 0x100000000 >> 0x20);
    memcpy(pcVar1,s + 1,lVar3 >> 0x20);
    pcVar4 = pcVar1 + (lVar3 >> 0x20);
  }
  else {
    sVar2 = strlen(s);
    pcVar1 = (char *)malloc((long)((sVar2 << 0x20) + 0x100000000) >> 0x20);
    memcpy(pcVar1,s,(long)(int)sVar2);
    pcVar4 = pcVar1 + (int)sVar2;
  }
  *pcVar4 = '\0';
  return pcVar1;
}

Assistant:

char *d_dup_pathname_str(const char *s) {
  const char *e = s;
  if (!s) return dup_str("", 0);
  if (*e == '"') {
    e++;
    while (*e && *e != '"') e++;
    return dup_str(s + 1, e);
  } else
    return dup_str(s, s + strlen(s));
}